

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O2

void __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::enqueue
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,async_msg *item)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->queue_mutex_);
  std::condition_variable::
  wait<spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::enqueue(spdlog::details::async_msg&&)::_lambda()_1_>
            (&this->pop_cv_,&uStack_28,(anon_class_8_1_8991fb9c)this);
  circular_q<spdlog::details::async_msg>::push_back(&this->q_,item);
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void enqueue(T &&item)
    {
        {
            std::unique_lock<std::mutex> lock(queue_mutex_);
            pop_cv_.wait(lock, [this] { return !this->q_.full(); });
            q_.push_back(std::move(item));
        }
        push_cv_.notify_one();
    }